

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::Reflection::UnsafeArenaReleaseMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  Descriptor *pDVar4;
  OneofDescriptor *pOVar5;
  uint32 *puVar6;
  Message **ppMVar7;
  MessageFactory *in_RCX;
  Reflection *in_RDX;
  Reflection *in_RDI;
  Message *ret;
  Message **result;
  Reflection *in_stack_00000040;
  char *in_stack_00000048;
  char *in_stack_00000050;
  undefined4 in_stack_00000058;
  CppType in_stack_0000005c;
  Descriptor *in_stack_00000060;
  FieldDescriptor *in_stack_00000068;
  Descriptor *in_stack_00000070;
  MessageFactory *in_stack_00000098;
  FieldDescriptor *in_stack_000000a0;
  ExtensionSet *in_stack_000000a8;
  Message *in_stack_ffffffffffffffb8;
  Message *in_stack_ffffffffffffffc8;
  Reflection *in_stack_ffffffffffffffd0;
  MessageLite *local_8;
  
  pDVar4 = FieldDescriptor::containing_type((FieldDescriptor *)in_RDX);
  if (pDVar4 != in_RDI->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000060,(FieldDescriptor *)CONCAT44(in_stack_0000005c,in_stack_00000058),
               in_stack_00000050,in_stack_00000048);
  }
  LVar2 = FieldDescriptor::label((FieldDescriptor *)in_RDX);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000060,(FieldDescriptor *)CONCAT44(in_stack_0000005c,in_stack_00000058),
               in_stack_00000050,in_stack_00000048);
  }
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x42b6af);
  if (CVar3 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (in_stack_00000070,in_stack_00000068,(char *)in_stack_00000060,in_stack_0000005c);
  }
  if (in_RCX == (MessageFactory *)0x0) {
    in_RCX = in_RDI->message_factory_;
  }
  bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)in_RDX);
  if (bVar1) {
    MutableExtensionSet(in_RDI,in_stack_ffffffffffffffb8);
    local_8 = internal::ExtensionSet::UnsafeArenaReleaseMessage
                        (in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
  }
  else {
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x42b72d);
    if ((!bVar1) &&
       (pOVar5 = FieldDescriptor::containing_oneof((FieldDescriptor *)in_RDX),
       pOVar5 == (OneofDescriptor *)0x0)) {
      ClearBit(in_stack_00000040,(Message *)this,(FieldDescriptor *)message);
    }
    pOVar5 = FieldDescriptor::containing_oneof((FieldDescriptor *)in_RDX);
    if (pOVar5 != (OneofDescriptor *)0x0) {
      bVar1 = HasOneofField(in_RDX,(Message *)in_RCX,(FieldDescriptor *)in_stack_ffffffffffffffd0);
      if (!bVar1) {
        return (Message *)0x0;
      }
      FieldDescriptor::containing_oneof((FieldDescriptor *)in_RDX);
      puVar6 = MutableOneofCase(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                                (OneofDescriptor *)in_RDI);
      *puVar6 = 0;
    }
    ppMVar7 = MutableRaw<google::protobuf::Message*>
                        (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                         (FieldDescriptor *)in_RDI);
    local_8 = &(*ppMVar7)->super_MessageLite;
    *ppMVar7 = (Message *)0x0;
  }
  return (Message *)local_8;
}

Assistant:

Message* Reflection::UnsafeArenaReleaseMessage(Message* message,
                                               const FieldDescriptor* field,
                                               MessageFactory* factory) const {
  USAGE_CHECK_ALL(ReleaseMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->UnsafeArenaReleaseMessage(field,
                                                                factory));
  } else {
    if (!(field->is_repeated() || field->containing_oneof())) {
      ClearBit(message, field);
    }
    if (field->containing_oneof()) {
      if (HasOneofField(*message, field)) {
        *MutableOneofCase(message, field->containing_oneof()) = 0;
      } else {
        return nullptr;
      }
    }
    Message** result = MutableRaw<Message*>(message, field);
    Message* ret = *result;
    *result = nullptr;
    return ret;
  }
}